

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bif.c
# Opt level: O3

void biffclose(bifcxdef *ctx,int argc)

{
  undefined8 in_RAX;
  FILE *__stream;
  int fnum;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  __stream = (FILE *)bif_get_file(ctx,&local_14,(int *)0x0);
  fclose(__stream);
  ctx->bifcxfile[local_14].fp = (osfildef *)0x0;
  return;
}

Assistant:

void biffclose(bifcxdef *ctx, int argc)
{
    int       fnum;
    osfildef *fp;

    /* get the file number */
    bifcntargs(ctx, 1, argc);
    fp = bif_get_file(ctx, &fnum, 0);

    /* close the file and release the slot */
    osfcls(fp);
    ctx->bifcxfile[fnum].fp = 0;
}